

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-copy-mpi.c
# Opt level: O1

void slave(void)

{
  int iVar1;
  size_t offset;
  int iVar2;
  undefined8 uVar3;
  undefined1 local_298 [8];
  BigArray array;
  BigBlockPtr ptrnew;
  MPI_Status status;
  int64_t work [2];
  int result;
  
  work[1]._4_4_ = 0;
  MPI_Send((long)work + 0xc,1,&ompi_mpi_int,0,0x50d,&ompi_mpi_comm_world);
  do {
    MPI_Recv(&status._ucount,1,MPI_TYPE_WORK,0,0xffffffff,&ompi_mpi_comm_world,&ptrnew.aoffset);
    offset = status._ucount;
    iVar1 = ptrnew.aoffset._4_4_;
    if (ptrnew.aoffset._4_4_ == 0x50a) {
      return;
    }
    iVar2 = big_block_read_simple(&bb,status._ucount,work[0],(BigArray *)local_298,(char *)0x0);
    if (iVar2 == 0) {
      iVar2 = big_block_seek(&bbnew,(BigBlockPtr *)&array.data,offset);
      if (iVar2 != 0) {
        slave_cold_2();
        goto LAB_00103e7a;
      }
      iVar2 = big_block_write(&bbnew,(BigBlockPtr *)&array.data,(BigArray *)local_298);
      if (iVar2 == 0) {
        free((void *)array.size);
        uVar3 = 0x50d;
      }
      else {
        slave_cold_3();
        uVar3 = 0x50f;
      }
    }
    else {
      slave_cold_1();
LAB_00103e7a:
      uVar3 = 0x50f;
    }
    MPI_Send((long)work + 0xc,1,&ompi_mpi_int,0,uVar3,&ompi_mpi_comm_world);
    if (iVar1 == 0x50a) {
      return;
    }
  } while( true );
}

Assistant:

void slave() {
    int result = 0;
    MPI_Send(&result, 1, MPI_INT, 0, DONE_TAG, MPI_COMM_WORLD);
    while(1) {
        int64_t work[2];
        MPI_Status status;
        MPI_Recv(work, 1, MPI_TYPE_WORK, 0, MPI_ANY_TAG, MPI_COMM_WORLD, &status);

        if(status.MPI_TAG == DIE_TAG) {
            break;
        }
        int64_t offset = work[0];
        int64_t chunksize = work[1];
        BigArray array;
        BigBlockPtr ptrnew;

        if(0 != big_block_read_simple(&bb, offset, chunksize, &array, NULL)) {
            fprintf(stderr, "failed to read original: %s\n", big_file_get_error_message());
            result = -1;
            goto bad;
        }
        if(0 != big_block_seek(&bbnew, &ptrnew, offset)) {
            fprintf(stderr, "failed to seek new: %s\n", big_file_get_error_message());
            result = -1;
            free(array.data);
            goto bad;
        }

        if(0 != big_block_write(&bbnew, &ptrnew, &array)) {
            fprintf(stderr, "failed to write new: %s\n", big_file_get_error_message());
            result = -1;
            free(array.data);
            goto bad;
        }

        free(array.data);
        MPI_Send(&result, 1, MPI_INT, 0, DONE_TAG, MPI_COMM_WORLD);
        continue;
    bad:
        MPI_Send(&result, 1, MPI_INT, 0, ERROR_TAG, MPI_COMM_WORLD);
        continue;
    }
    return;
}